

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quasiquote_conversion.cpp
# Opt level: O3

bool __thiscall
skiwi::anon_unknown_26::quasiquote_conversion_visitor::tag_is_comma
          (quasiquote_conversion_visitor *this,cell *c)

{
  _func_int **pp_Var1;
  int iVar2;
  bool bVar3;
  
  if (*(int *)&(this->
               super_base_visitor<skiwi::(anonymous_namespace)::quasiquote_conversion_visitor>).
               _vptr_base_visitor == 4) {
    pp_Var1 = this[5].
              super_base_visitor<skiwi::(anonymous_namespace)::quasiquote_conversion_visitor>.
              _vptr_base_visitor;
    if (((long)this[6].
               super_base_visitor<skiwi::(anonymous_namespace)::quasiquote_conversion_visitor>.
               _vptr_base_visitor - (long)pp_Var1 == 0xb0) && (*(int *)pp_Var1 == 0)) {
      iVar2 = std::__cxx11::string::compare((char *)(pp_Var1 + 1));
      if (iVar2 == 0) {
        bVar3 = true;
      }
      else {
        iVar2 = std::__cxx11::string::compare
                          ((char *)(this[5].
                                    super_base_visitor<skiwi::(anonymous_namespace)::quasiquote_conversion_visitor>
                                    ._vptr_base_visitor + 1));
        bVar3 = iVar2 == 0;
      }
    }
    else {
      bVar3 = false;
    }
    return bVar3;
  }
  return false;
}

Assistant:

bool tag_is_comma(const cell& c)
      {
      if (c.type == ct_pair && c.pair.size() == 2)
        {
        return (c.pair[0].type == ct_symbol && ((c.pair[0].value == ",") || (c.pair[0].value == "unquote")));
        }
      return false;
      }